

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.h
# Opt level: O2

void __thiscall
CoreML::Specification::PermuteLayerParams::_internal_add_axis
          (PermuteLayerParams *this,uint64_t value)

{
  uint64_t local_8;
  
  local_8 = value;
  google::protobuf::RepeatedField<unsigned_long>::Add(&this->axis_,&local_8);
  return;
}

Assistant:

inline void PermuteLayerParams::_internal_add_axis(uint64_t value) {
  axis_.Add(value);
}